

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O1

int __thiscall MeCab::Param::help_version(Param *this)

{
  bool bVar1;
  size_t sVar2;
  char *__s;
  
  bVar1 = get<bool>(this,"help");
  if (bVar1) {
    __s = (this->help_)._M_dataplus._M_p;
  }
  else {
    bVar1 = get<bool>(this,"version");
    if (!bVar1) {
      return 1;
    }
    __s = (this->version_)._M_dataplus._M_p;
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x17b2c8);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  return 0;
}

Assistant:

int Param::help_version() const {
  if (get<bool>("help")) {
    std::cout << help();
    return 0;
  }

  if (get<bool>("version")) {
    std::cout << version();
    return 0;
  }

  return 1;
}